

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::setCapacity
          (Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> newBuilder;
  size_t newSize_local;
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
            ((ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_38,
             (kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>(&this->builder);
  ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>::
  addAll<kj::ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>
            ((ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>>
                     ((ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_38
                     );
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
            (&this->builder,pAVar2);
  ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~ArrayBuilder
            ((ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }